

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool absl::str_format_internal::ConvertIntArg<unsigned_short>
               (unsigned_short v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatSinkImpl *in_R8;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  IntDigits *local_68;
  uint local_60;
  IntDigits local_58;
  
  conv_01._0_4_ = conv.precision_;
  conv_00._0_8_ = conv._0_8_;
  conv_01.precision_ = (int)sink;
  local_68 = conv_00._0_8_;
  local_60 = conv_01._0_4_;
  switch((ulong)conv_00._0_8_ & 0xff) {
  case 0:
    if ((conv._0_4_ & 0xff0000U) != 0x20000) {
      conv_00.precision_ = conv_01.precision_;
      anon_unknown_53::ConvertCharImpl
                ((char)v,conv_00,(FormatSinkImpl *)&switchD_00178a88::switchdataD_001a9f60);
      return true;
    }
    conv_02.width_ = 0;
    conv_02.conv_ = (char)conv_01._0_4_;
    conv_02.flags_ = (char)(conv_01._0_4_ >> 8);
    conv_02.length_mod_ = (char)(conv_01._0_4_ >> 0x10);
    conv_02._3_1_ = (char)(conv_01._0_4_ >> 0x18);
    conv_02.precision_ = conv_01.precision_;
    bVar1 = anon_unknown_53::ConvertWCharTImpl((anon_unknown_53 *)(ulong)v,conv._0_4_,conv_02,in_R8)
    ;
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O2/_deps/abseil-cpp-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = unsigned short]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    anon_unknown_53::IntDigits::PrintAsDec<unsigned_short>(&local_58,v);
    break;
  case 4:
    anon_unknown_53::IntDigits::PrintAsOct<unsigned_short>(&local_58,v);
    break;
  case 6:
    anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_short>(&local_58,v);
    break;
  case 7:
    anon_unknown_53::IntDigits::PrintAsHexUpper<unsigned_short>(&local_58,v);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    bVar1 = ConvertFloatImpl((double)v,(FormatConversionSpecImpl *)&local_68,sink);
    return bVar1;
  }
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_00._M_str = local_58.start_;
    v_00._M_len = local_58.size_;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_01.width_ = 0;
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_58,conv_00._0_8_,conv_01,in_R8);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}